

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateData::FillBoundary
          (StateData *this,Box *bx,FArrayBox *dest,Real time,Geometry *geom,int dest_comp,
          int src_comp,int num_comp)

{
  pointer pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  BCRec *pBVar4;
  BndryFunc *pBVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined4 uVar13;
  int iVar14;
  StateDescriptor *this_00;
  int iVar15;
  int *bxlo;
  ulong uVar16;
  uint uVar17;
  undefined4 uVar18;
  allocator_type local_89;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcr;
  uint uStack_70;
  ulong uVar9;
  
  uVar8 = (this->domain).btype.itype;
  pBVar1 = *(pointer *)(bx->smallend).vect;
  uVar2 = *(undefined8 *)((bx->smallend).vect + 2);
  uVar3 = *(undefined8 *)((bx->bigend).vect + 2);
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (int)uVar3;
  uStack_70 = (uint)((ulong)uVar3 >> 0x20);
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = (int)uVar2;
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = (int)((ulong)uVar2 >> 0x20);
  lVar6 = 0;
  do {
    uVar10 = 1 << ((byte)lVar6 & 0x1f);
    uVar17 = (uint)lVar6;
    *(uint *)((long)&bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_finish + lVar6 * 4 + 4) =
         (*(int *)((long)&bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar6 * 4 + 4) +
         (uint)((uVar8 >> (uVar17 & 0x1f) & 1) != 0)) -
         (uint)((uStack_70 >> (uVar17 & 0x1f) & 1) != 0);
    if ((uVar8 >> (uVar17 & 0x1f) & 1) == 0) {
      uStack_70 = ~uVar10 & uStack_70;
    }
    else {
      uStack_70 = uVar10 | uStack_70;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = (int)pBVar1;
  if (((((int)bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start < (this->domain).smallend.vect[0]) ||
       (bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = (int)((ulong)pBVar1 >> 0x20),
       bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_ < (this->domain).smallend.vect[1])) ||
      ((int)bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_finish < (this->domain).smallend.vect[2])) ||
     ((((this->domain).bigend.vect[0] <
        bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ ||
       ((this->domain).bigend.vect[1] <
        (int)bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage)) ||
      ((this->domain).bigend.vect[2] <
       bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_)))) {
    bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
    _M_start = pBVar1;
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              (&bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)num_comp,
               &local_89);
    if (0 < num_comp) {
      iVar15 = 0;
      do {
        uVar17 = iVar15 + dest_comp;
        uVar8 = iVar15 + src_comp;
        uVar9 = (ulong)uVar8;
        this_00 = this->desc;
        uVar18 = SUB84(time,0);
        if ((this_00->m_primary).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [(int)uVar8] == 0) {
          pBVar4 = StateDescriptor::getBC(this_00,uVar8);
          lVar6 = 0;
          do {
            uVar11 = 0;
            uVar13 = 0;
            if (*(int *)((long)(bx->smallend).vect + lVar6) <=
                *(int *)((long)(this->domain).smallend.vect + lVar6)) {
              uVar13 = *(undefined4 *)((long)pBVar4->bc + lVar6);
            }
            *(undefined4 *)
             ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar6) = uVar13;
            if (*(int *)((long)(this->domain).bigend.vect + lVar6) <=
                *(int *)((long)(bx->bigend).vect + lVar6)) {
              uVar11 = *(undefined4 *)((long)pBVar4->bc + lVar6 + 0xc);
            }
            *(undefined4 *)
             ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                     super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                     super__Vector_impl_data._M_start)->bc + lVar6 + 0xc) = uVar11;
            lVar6 = lVar6 + 4;
          } while (lVar6 != 0xc);
          pBVar5 = StateDescriptor::bndryFill(this->desc,uVar8);
          (*pBVar5->_vptr_BndryFunc[5])(uVar18,pBVar5,bx,dest,(ulong)uVar17,1,geom,&bcr,0,uVar9);
LAB_004cffea:
          iVar15 = iVar15 + 1;
        }
        else {
          uVar10 = (this_00->m_groupsize).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(int)uVar8];
          if (num_comp < (int)(uVar10 + iVar15)) {
            pBVar4 = StateDescriptor::getBC(this_00,uVar8);
            lVar6 = 0;
            do {
              uVar11 = 0;
              uVar13 = 0;
              if (*(int *)((long)(bx->smallend).vect + lVar6) <=
                  *(int *)((long)(this->domain).smallend.vect + lVar6)) {
                uVar13 = *(undefined4 *)((long)pBVar4->bc + lVar6);
              }
              *(undefined4 *)
               ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                       super__Vector_impl_data._M_start)->bc + lVar6) = uVar13;
              if (*(int *)((long)(this->domain).bigend.vect + lVar6) <=
                  *(int *)((long)(bx->bigend).vect + lVar6)) {
                uVar11 = *(undefined4 *)((long)pBVar4->bc + lVar6 + 0xc);
              }
              *(undefined4 *)
               ((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                       super__Vector_impl_data._M_start)->bc + lVar6 + 0xc) = uVar11;
              lVar6 = lVar6 + 4;
            } while (lVar6 != 0xc);
            pBVar5 = StateDescriptor::bndryFill(this->desc,uVar8);
            (*pBVar5->_vptr_BndryFunc[5])(uVar18,pBVar5,bx,dest,(ulong)uVar17,1,geom,&bcr,0,uVar9);
            goto LAB_004cffea;
          }
          if (0 < (int)uVar10) {
            lVar6 = 0xc;
            uVar16 = 0;
            do {
              pBVar4 = StateDescriptor::getBC(this->desc,uVar8 + (int)uVar16);
              lVar7 = -3;
              do {
                iVar12 = 0;
                iVar14 = 0;
                if ((bx->bigend).vect[lVar7] <= (this->domain).bigend.vect[lVar7]) {
                  iVar14 = pBVar4->bc[lVar7 + 3];
                }
                *(int *)((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bc + lVar7 * 4 + lVar6) =
                     iVar14;
                if ((int)((IndexType *)(&(this->domain).bigend + 1))[lVar7].itype <=
                    (int)((IndexType *)(&bx->bigend + 1))[lVar7].itype) {
                  iVar12 = pBVar4[1].bc[lVar7];
                }
                *(int *)((long)(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start)->bc +
                        lVar7 * 4 + lVar6 + 0xc) = iVar12;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 0);
              uVar16 = uVar16 + 1;
              lVar6 = lVar6 + 0x18;
            } while (uVar16 != uVar10);
            this_00 = this->desc;
          }
          pBVar5 = StateDescriptor::bndryFill(this_00,uVar8);
          (*pBVar5->_vptr_BndryFunc[5])
                    (uVar18,pBVar5,bx,dest,(ulong)uVar17,(ulong)uVar10,geom,&bcr,0,uVar9);
          iVar15 = uVar10 + iVar15;
        }
      } while (iVar15 < num_comp);
    }
    if (bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT44(bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                               super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                               (int)bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage) -
                      (long)bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
StateData::FillBoundary (Box const&      bx,
                         FArrayBox&      dest,
                         Real            time,
                         const Geometry& geom,
                         int             dest_comp,
                         int             src_comp,
                         int             num_comp)
{
    BL_PROFILE("StateData::FillBoundary(geom)");

    if (domain.contains(convert(bx,domain.ixType()))) return;

    Vector<BCRec> bcr(num_comp);

    for (int i = 0; i < num_comp; )
    {
        const int dc  = dest_comp+i;
        const int sc  = src_comp+i;

        if (desc->primary(sc))
        {
            const int groupsize = desc->groupsize(sc);

            BL_ASSERT(groupsize != 0);

            if (groupsize+i <= num_comp)
            {
                for (int j = 0; j < groupsize; j++)
                {
                    amrex::setBC(bx,domain,desc->getBC(sc+j),bcr[j]);
                }
                //
                // Use the "group" boundary fill routine.
                //
                desc->bndryFill(sc)(bx,dest,dc,groupsize,geom,time,bcr,0,sc);
                i += groupsize;
            }
            else
            {
                amrex::setBC(bx,domain,desc->getBC(sc),bcr[0]);
                desc->bndryFill(sc)(bx,dest,dc,1,geom,time,bcr,0,sc);
                i++;
            }
        }
        else
        {
            amrex::setBC(bx,domain,desc->getBC(sc),bcr[0]);
            desc->bndryFill(sc)(bx,dest,dc,1,geom,time,bcr,0,sc);
            i++;
        }
    }
}